

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O2

void mdct_forward(mdct_lookup *init,float *in,float *out)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  float *pfVar8;
  int points;
  float *pfVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  float *x;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  long lStack_50;
  undefined8 local_48;
  long local_40;
  int local_38;
  int local_34;
  
  iVar7 = init->n;
  points = iVar7 >> 1;
  uVar18 = iVar7 >> 2;
  local_40 = (long)iVar7;
  lVar5 = -((long)iVar7 * 4 + 0xfU & 0xfffffffffffffff0);
  x = (float *)((long)&local_48 + lVar5);
  local_38 = points;
  lVar17 = (long)points;
  pfVar4 = x + lVar17;
  lVar11 = (long)(int)uVar18;
  pfVar8 = in + lVar17 + lVar11;
  pfVar16 = in + lVar17 + lVar11 + 1;
  pfVar13 = init->trig;
  pfVar9 = pfVar13 + lVar17;
  local_34 = iVar7 >> 3;
  local_48 = in;
  pfVar14 = in + lVar11 + -2;
  pfVar15 = x;
  for (lVar11 = 0; pfVar1 = local_48, pfVar13 = pfVar13 + -2, lVar11 < iVar7 >> 3;
      lVar11 = lVar11 + 2) {
    pfVar1 = pfVar8 + -4;
    pfVar2 = pfVar8 + -2;
    pfVar8 = pfVar8 + -4;
    pfVar3 = pfVar9 + -2;
    pfVar9 = pfVar9 + -2;
    fVar20 = (float)*(undefined8 *)pfVar3;
    fVar21 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
    *(ulong *)(pfVar4 + lVar11) =
         CONCAT44((*pfVar1 + pfVar16[2]) * fVar20 + -(*pfVar2 + *pfVar16) * fVar21,
                  (*pfVar1 + pfVar16[2]) * fVar21 + (*pfVar2 + *pfVar16) * fVar20);
    pfVar16 = pfVar16 + 4;
    pfVar15 = pfVar15 + 2;
    pfVar14 = pfVar14 + -4;
  }
  pfVar8 = local_48 + 1;
  iVar7 = local_38 - local_34;
  for (; lVar6 = local_40, lVar11 < iVar7; lVar11 = lVar11 + 2) {
    pfVar9 = pfVar9 + -2;
    fVar20 = (float)*(undefined8 *)(pfVar13 + lVar17);
    fVar21 = (float)((ulong)*(undefined8 *)(pfVar13 + lVar17) >> 0x20);
    *(ulong *)(pfVar15 + lVar17) =
         CONCAT44((pfVar14[lVar17 + -2] - pfVar8[2]) * fVar20 +
                  -(pfVar14[lVar17] - *pfVar8) * fVar21,
                  (pfVar14[lVar17 + -2] - pfVar8[2]) * fVar21 + (pfVar14[lVar17] - *pfVar8) * fVar20
                 );
    pfVar8 = pfVar8 + 4;
    pfVar15 = pfVar15 + 2;
    pfVar14 = pfVar14 + -4;
    pfVar13 = pfVar13 + -2;
  }
  *(undefined8 *)((long)&lStack_50 + lVar5) = 0xfffffffffffffffe;
  lVar12 = *(long *)((long)&lStack_50 + lVar5);
  for (; lVar11 < lVar17; lVar11 = lVar11 + 2) {
    fVar21 = -pfVar1[lVar6 + lVar12 * 2 + 2] - *pfVar8;
    fVar20 = -pfVar1[lVar6 + lVar12 * 2] - pfVar8[2];
    fVar22 = (float)*(undefined8 *)(pfVar9 + lVar12);
    fVar23 = (float)((ulong)*(undefined8 *)(pfVar9 + lVar12) >> 0x20);
    *(ulong *)(pfVar4 + lVar11) =
         CONCAT44(fVar20 * fVar22 + -fVar21 * fVar23,fVar20 * fVar23 + fVar21 * fVar22);
    pfVar8 = pfVar8 + 4;
    lVar12 = lVar12 + -2;
  }
  *(undefined8 *)((long)&lStack_50 + lVar5) = 0x1bc3c6;
  mdct_butterflies(init,pfVar4,points);
  *(undefined8 *)((long)&lStack_50 + lVar5) = 0x1bc3d1;
  mdct_bitreverse(init,x);
  pfVar4 = init->trig;
  uVar10 = 0;
  lVar11 = lVar17;
  uVar19 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    uVar19 = uVar10;
  }
  for (; lVar11 = lVar11 + -1, uVar19 != uVar10; uVar10 = uVar10 + 1) {
    fVar20 = x[uVar10 * 2];
    fVar21 = *(float *)((long)&local_48 + uVar10 * 8 + lVar5 + 4);
    out[uVar10] = (pfVar4[lVar17 + uVar10 * 2] * fVar20 + pfVar4[lVar17 + uVar10 * 2 + 1] * fVar21)
                  * init->scale;
    out[lVar11] = (fVar20 * pfVar4[lVar17 + uVar10 * 2 + 1] - fVar21 * pfVar4[lVar17 + uVar10 * 2])
                  * init->scale;
  }
  return;
}

Assistant:

void mdct_forward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;
  int n8=n>>3;
  DATA_TYPE *w=alloca(n*sizeof(*w)); /* forward needs working space */
  DATA_TYPE *w2=w+n2;

  /* rotate */

  /* window + rotate + step 1 */

  REG_TYPE r0;
  REG_TYPE r1;
  DATA_TYPE *x0=in+n2+n4;
  DATA_TYPE *x1=x0+1;
  DATA_TYPE *T=init->trig+n2;

  int i=0;

  for(i=0;i<n8;i+=2){
    x0 -=4;
    T-=2;
    r0= x0[2] + x1[0];
    r1= x0[0] + x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x1=in+1;

  for(;i<n2-n8;i+=2){
    T-=2;
    x0 -=4;
    r0= x0[2] - x1[0];
    r1= x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }

  x0=in+n;

  for(;i<n2;i+=2){
    T-=2;
    x0 -=4;
    r0= -x0[2] - x1[0];
    r1= -x0[0] - x1[2];
    w2[i]=   MULT_NORM(r1*T[1] + r0*T[0]);
    w2[i+1]= MULT_NORM(r1*T[0] - r0*T[1]);
    x1 +=4;
  }


  mdct_butterflies(init,w+n2,n2);
  mdct_bitreverse(init,w);

  /* roatate + window */

  T=init->trig+n2;
  x0=out+n2;

  for(i=0;i<n4;i++){
    x0--;
    out[i] =MULT_NORM((w[0]*T[0]+w[1]*T[1])*init->scale);
    x0[0]  =MULT_NORM((w[0]*T[1]-w[1]*T[0])*init->scale);
    w+=2;
    T+=2;
  }
}